

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_primitive_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::javanano::PrimitiveFieldGenerator::GenerateHashCodeCode
          (PrimitiveFieldGenerator *this,Printer *printer)

{
  JavaType JVar1;
  LogMessage *other;
  char *text;
  LogFinisher local_49;
  LogMessage local_48;
  
  JVar1 = GetJavaType(this->descriptor_);
  if (JVar1 != JAVATYPE_STRING) {
    if (JVar1 == JAVATYPE_BYTES) {
      text = "result = 31 * result + java.util.Arrays.hashCode(this.$name$);\n";
      goto LAB_002bd29f;
    }
    if (((this->super_FieldGenerator).params_)->use_reference_types_for_primitives_ != true) {
      switch(JVar1) {
      case JAVATYPE_INT:
        text = "result = 31 * result + this.$name$;\n";
        break;
      case JAVATYPE_LONG:
        text = "result = 31 * result\n    + (int) (this.$name$ ^ (this.$name$ >>> 32));\n";
        break;
      case JAVATYPE_FLOAT:
        text = "result = 31 * result\n    + java.lang.Float.floatToIntBits(this.$name$);\n";
        break;
      case JAVATYPE_DOUBLE:
        text = 
        "{\n  long v = java.lang.Double.doubleToLongBits(this.$name$);\n  result = 31 * result + (int) (v ^ (v >>> 32));\n}\n"
        ;
        break;
      case JAVATYPE_BOOLEAN:
        text = "result = 31 * result + (this.$name$ ? 1231 : 1237);\n";
        break;
      default:
        internal::LogMessage::LogMessage
                  (&local_48,LOGLEVEL_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/javanano/javanano_primitive_field.cc"
                   ,0x1f1);
        other = internal::LogMessage::operator<<(&local_48,"unknown java type for primitive field");
        internal::LogFinisher::operator=(&local_49,other);
        internal::LogMessage::~LogMessage(&local_48);
        return;
      }
      goto LAB_002bd29f;
    }
  }
  text = "result = 31 * result\n    + (this.$name$ == null ? 0 : this.$name$.hashCode());\n";
LAB_002bd29f:
  io::Printer::Print(printer,&this->variables_,text);
  return;
}

Assistant:

void PrimitiveFieldGenerator::
GenerateHashCodeCode(io::Printer* printer) const {
  JavaType java_type = GetJavaType(descriptor_);
  if (java_type == JAVATYPE_BYTES) {
    printer->Print(variables_,
      "result = 31 * result + java.util.Arrays.hashCode(this.$name$);\n");
  } else if (java_type == JAVATYPE_STRING
      || params_.use_reference_types_for_primitives()) {
    printer->Print(variables_,
      "result = 31 * result\n"
      "    + (this.$name$ == null ? 0 : this.$name$.hashCode());\n");
  } else {
    switch (java_type) {
      // For all Java primitive types below, the hash codes match the
      // results of BoxedType.valueOf(primitiveValue).hashCode().
      case JAVATYPE_INT:
        printer->Print(variables_,
          "result = 31 * result + this.$name$;\n");
        break;
      case JAVATYPE_LONG:
        printer->Print(variables_,
          "result = 31 * result\n"
          "    + (int) (this.$name$ ^ (this.$name$ >>> 32));\n");
        break;
      case JAVATYPE_FLOAT:
        printer->Print(variables_,
          "result = 31 * result\n"
          "    + java.lang.Float.floatToIntBits(this.$name$);\n");
        break;
      case JAVATYPE_DOUBLE:
        printer->Print(variables_,
          "{\n"
          "  long v = java.lang.Double.doubleToLongBits(this.$name$);\n"
          "  result = 31 * result + (int) (v ^ (v >>> 32));\n"
          "}\n");
        break;
      case JAVATYPE_BOOLEAN:
        printer->Print(variables_,
          "result = 31 * result + (this.$name$ ? 1231 : 1237);\n");
        break;
      default:
        GOOGLE_LOG(ERROR) << "unknown java type for primitive field";
        break;
    }
  }
}